

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerCheckWasmSignature(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  uint index;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *pRVar8;
  IndirOpnd *pIVar9;
  AsmJsJITInfo *pAVar10;
  WasmSignature *this_01;
  size_t sVar11;
  LabelInstr *target;
  LabelInstr *target_00;
  Lowerer *this_02;
  intptr_t address;
  AddrOpnd *opndArg;
  
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar4);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2165,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_00557286;
    *puVar5 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2166,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar3) goto LAB_00557286;
    *puVar5 = 0;
  }
  bVar3 = IR::Opnd::IsIntConstOpnd(instr->m_src2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2167,"(instr->GetSrc2()->IsIntConstOpnd())",
                       "instr->GetSrc2()->IsIntConstOpnd()");
    if (!bVar3) {
LAB_00557286:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pOVar6 = IR::Instr::UnlinkSrc2(instr);
  pIVar7 = IR::Opnd::AsIntConstOpnd(pOVar6);
  index = IR::IntConstOpnd::AsInt32(pIVar7);
  pIVar1 = instr->m_prev;
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  pRVar8 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar9 = IR::IndirOpnd::New(pRVar8,0x50,TyInt64,this->m_func,false);
  pJVar4 = Func::GetJITFunctionBody(this->m_func);
  pAVar10 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
  this_01 = AsmJsJITInfo::GetWasmSignature(pAVar10,index);
  sVar11 = Wasm::WasmSignature::GetShortSig(this_01);
  if (sVar11 == 0xffffffffffffffff) {
    pJVar4 = Func::GetJITFunctionBody(this->m_func);
    pAVar10 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
    address = AsmJsJITInfo::GetWasmSignatureAddr(pAVar10,index);
    opndArg = IR::AddrOpnd::New(address,AddrOpndKindConstantAddress,this->m_func,false,(Var)0x0);
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instr,&pIVar9->super_Opnd);
    LoadScriptContext(this,instr);
    LowererMD::ChangeToHelperCall
              (this_00,instr,HelperOp_CheckWasmSignature,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,false);
  }
  else {
    target = InsertLabel(true,instr);
    target_00 = InsertLabel(false,instr->m_next);
    pRVar8 = IR::RegOpnd::New(TyInt64,this->m_func);
    InsertMove(&pRVar8->super_Opnd,&pIVar9->super_Opnd,&target->super_Instr,true);
    pIVar9 = IR::IndirOpnd::New(pRVar8,0x10,TyInt64,this->m_func,false);
    this_02 = (Lowerer *)Wasm::WasmSignature::GetShortSig(this_01);
    pIVar7 = IR::IntConstOpnd::New((IntConstType)this_02,TyInt64,this->m_func,false);
    InsertCompareBranch(this_02,&pIVar9->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,target,
                        &target->super_Instr,false);
    InsertBranch(Br,target_00,&target->super_Instr);
    pOVar6 = IR::IntConstOpnd::NewFromType(0x1b66,TyInt32,this->m_func);
    GenerateThrow(this,pOVar6,instr);
    IR::Instr::Remove(instr);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerCheckWasmSignature(IR::Instr * instr)
{
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc2()->IsIntConstOpnd());

    int sigId = instr->UnlinkSrc2()->AsIntConstOpnd()->AsInt32();

    IR::Instr *instrPrev = instr->m_prev;

    IR::IndirOpnd * actualSig = IR::IndirOpnd::New(instr->UnlinkSrc1()->AsRegOpnd(), Js::WasmScriptFunction::GetOffsetOfSignature(), TyMachReg, m_func);

    Wasm::WasmSignature * expectedSig = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignature(sigId);
    if (expectedSig->GetShortSig() == Js::Constants::InvalidSignature)
    {
        intptr_t sigAddr = m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetWasmSignatureAddr(sigId);
        IR::AddrOpnd * expectedOpnd = IR::AddrOpnd::New(sigAddr, IR::AddrOpndKindConstantAddress, m_func);
        m_lowererMD.LoadHelperArgument(instr, expectedOpnd);
        m_lowererMD.LoadHelperArgument(instr, actualSig);

        LoadScriptContext(instr);

        m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CheckWasmSignature);
    }
    else
    {
        IR::LabelInstr * trapLabel = InsertLabel(true, instr);
        IR::LabelInstr * labelFallThrough = InsertLabel(false, instr->m_next);
        IR::RegOpnd * actualRegOpnd = IR::RegOpnd::New(TyMachReg, m_func);
        InsertMove(actualRegOpnd, actualSig, trapLabel);

        IR::IndirOpnd * shortSigIndir = IR::IndirOpnd::New(actualRegOpnd, Wasm::WasmSignature::GetOffsetOfShortSig(), TyMachReg, m_func);
        InsertCompareBranch(shortSigIndir, IR::IntConstOpnd::New(expectedSig->GetShortSig(), TyMachReg, m_func), Js::OpCode::BrNeq_A, trapLabel, trapLabel);

        InsertBranch(Js::OpCode::Br, labelFallThrough, trapLabel);

        GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_SignatureMismatch), TyInt32, m_func), instr);

        instr->Remove();

    }


    return instrPrev;
}